

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcTShapeProfileDef::IfcTShapeProfileDef(IfcTShapeProfileDef *this)

{
  *(undefined ***)&this->field_0x100 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x108 = 0;
  *(char **)&this->field_0x110 = "IfcTShapeProfileDef";
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__00850908);
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x78 = 0;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x850878;
  *(undefined8 *)&this->field_0x100 = 0x8508f0;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0x8508a0
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x8508c8;
  (this->FilletRadius).have = false;
  (this->FlangeEdgeRadius).have = false;
  (this->WebEdgeRadius).have = false;
  (this->WebSlope).have = false;
  (this->FlangeSlope).have = false;
  (this->CentreOfGravityInY).have = false;
  return;
}

Assistant:

IfcTShapeProfileDef() : Object("IfcTShapeProfileDef") {}